

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVInt.cpp
# Opt level: O0

SVInt slang::SVInt::udiv(SVInt *lhs,SVInt *rhs,bool bothSigned)

{
  bool bVar1;
  bitwidth_t bVar2;
  uint32_t uVar3;
  SVInt *in_RDX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  undefined8 extraout_RDX_04;
  undefined8 uVar4;
  SVInt *in_RSI;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 in_RDI;
  undefined1 uVar5;
  SVInt SVar6;
  SVInt *in_stack_00000010;
  SVInt *in_stack_00000018;
  uint32_t rhsWords;
  bitwidth_t rhsBits;
  uint32_t lhsWords;
  bitwidth_t lhsBits;
  SVInt *quotient;
  SVInt *in_stack_00000238;
  SVInt *in_stack_00000240;
  uint32_t in_stack_0000024c;
  SVInt *in_stack_00000250;
  uint32_t in_stack_0000025c;
  SVInt *in_stack_00000260;
  undefined1 in_stack_ffffffffffffff9f;
  undefined7 in_stack_ffffffffffffffa0;
  undefined1 in_stack_ffffffffffffffa7;
  undefined4 local_58;
  bitwidth_t in_stack_ffffffffffffffac;
  uint uVar7;
  uint bits;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 this;
  
  this = in_RDI;
  bVar1 = isSingleWord(in_RSI);
  if (bVar1) {
    SVInt((SVInt *)this.pVal,in_stack_ffffffffffffffac,
          CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0),
          (bool)in_stack_ffffffffffffff9f);
    uVar4 = extraout_RDX;
  }
  else {
    bVar2 = getActiveBits((SVInt *)CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0));
    if (bVar2 == 0) {
      uVar7 = 0;
    }
    else {
      uVar3 = whichWord(bVar2 - 1);
      uVar7 = uVar3 + 1;
    }
    bits = uVar7;
    bVar2 = getActiveBits((SVInt *)CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0));
    if (bVar2 == 0) {
      local_58 = 0;
    }
    else {
      uVar3 = whichWord(bVar2 - 1);
      local_58 = uVar3 + 1;
    }
    if (uVar7 == 0) {
      SVInt((SVInt *)this.pVal,bits,CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0),
            (bool)in_stack_ffffffffffffff9f);
      uVar4 = extraout_RDX_00;
    }
    else if (in_RSI == in_RDX) {
      SVInt((SVInt *)this.pVal,bits,CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0),
            (bool)in_stack_ffffffffffffff9f);
      uVar4 = extraout_RDX_01;
    }
    else {
      uVar5 = uVar7 < local_58;
      operator<(in_stack_00000018,in_stack_00000010);
      bVar1 = operator||(false,(logic_t)0x0);
      if (bVar1) {
        SVInt((SVInt *)this.pVal,bits,CONCAT17(uVar5,in_stack_ffffffffffffffa0),
              (bool)in_stack_ffffffffffffff9f);
        uVar4 = extraout_RDX_02;
      }
      else if ((uVar7 == 1) && (local_58 == 1)) {
        SVInt((SVInt *)this.pVal,bits,CONCAT17(uVar5,in_stack_ffffffffffffffa0),
              (bool)in_stack_ffffffffffffff9f);
        uVar4 = extraout_RDX_03;
      }
      else {
        SVInt((SVInt *)0x3fc0d2);
        divide(in_stack_00000260,in_stack_0000025c,in_stack_00000250,in_stack_0000024c,
               in_stack_00000240,in_stack_00000238);
        uVar4 = extraout_RDX_04;
      }
    }
  }
  SVar6.super_SVIntStorage.bitWidth = (int)uVar4;
  SVar6.super_SVIntStorage.signFlag = (bool)(char)((ulong)uVar4 >> 0x20);
  SVar6.super_SVIntStorage.unknownFlag = (bool)(char)((ulong)uVar4 >> 0x28);
  SVar6.super_SVIntStorage._14_2_ = (short)((ulong)uVar4 >> 0x30);
  SVar6.super_SVIntStorage.field_0.val = in_RDI.val;
  return (SVInt)SVar6.super_SVIntStorage;
}

Assistant:

SVInt SVInt::udiv(const SVInt& lhs, const SVInt& rhs, bool bothSigned) {
    // At this point we have two values with the same bit widths, both positive,
    // and X's have been dealt with. Also, we know rhs isn't zero.
    if (lhs.isSingleWord())
        return SVInt(lhs.bitWidth, lhs.val / rhs.val, bothSigned);

    bitwidth_t lhsBits = lhs.getActiveBits();
    uint32_t lhsWords = !lhsBits ? 0 : (whichWord(lhsBits - 1) + 1);
    bitwidth_t rhsBits = rhs.getActiveBits();
    uint32_t rhsWords = !rhsBits ? 0 : (whichWord(rhsBits - 1) + 1);

    // 0 / X
    if (!lhsWords)
        return SVInt(lhs.bitWidth, 0, bothSigned);
    // X / X
    if (&lhs == &rhs)
        return SVInt(lhs.bitWidth, 1, bothSigned);
    // X / Y where X < Y
    if (lhsWords < rhsWords || lhs < rhs)
        return SVInt(lhs.bitWidth, 0, bothSigned);
    // X and Y are actually a single word
    if (lhsWords == 1 && rhsWords == 1)
        return SVInt(lhs.bitWidth, lhs.pVal[0] / rhs.pVal[0], bothSigned);

    // compute it the hard way with the Knuth algorithm
    SVInt quotient;
    divide(lhs, lhsWords, rhs, rhsWords, &quotient, nullptr);
    return quotient;
}